

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutionReport.h
# Opt level: O0

void __thiscall
FIX40::ExecutionReport::ExecutionReport
          (ExecutionReport *this,OrderID *aOrderID,ExecID *aExecID,ExecTransType *aExecTransType,
          OrdStatus *aOrdStatus,Symbol *aSymbol,Side *aSide,OrderQty *aOrderQty,
          LastShares *aLastShares,LastPx *aLastPx,CumQty *aCumQty,AvgPx *aAvgPx)

{
  MsgType local_90;
  Symbol *local_38;
  Symbol *aSymbol_local;
  OrdStatus *aOrdStatus_local;
  ExecTransType *aExecTransType_local;
  ExecID *aExecID_local;
  OrderID *aOrderID_local;
  ExecutionReport *this_local;
  
  local_38 = aSymbol;
  aSymbol_local = (Symbol *)aOrdStatus;
  aOrdStatus_local = (OrdStatus *)aExecTransType;
  aExecTransType_local = (ExecTransType *)aExecID;
  aExecID_local = (ExecID *)aOrderID;
  aOrderID_local = (OrderID *)this;
  MsgType();
  FIX40::Message::Message(&this->super_Message,&local_90);
  FIX::MsgType::~MsgType(&local_90);
  *(undefined ***)&this->super_Message = &PTR__ExecutionReport_0050aee0;
  set(this,(OrderID *)aExecID_local);
  set(this,(ExecID *)aExecTransType_local);
  set(this,(ExecTransType *)aOrdStatus_local);
  set(this,(OrdStatus *)aSymbol_local);
  set(this,local_38);
  set(this,aSide);
  set(this,aOrderQty);
  set(this,aLastShares);
  set(this,aLastPx);
  set(this,aCumQty);
  set(this,aAvgPx);
  return;
}

Assistant:

ExecutionReport(
      const FIX::OrderID& aOrderID,
      const FIX::ExecID& aExecID,
      const FIX::ExecTransType& aExecTransType,
      const FIX::OrdStatus& aOrdStatus,
      const FIX::Symbol& aSymbol,
      const FIX::Side& aSide,
      const FIX::OrderQty& aOrderQty,
      const FIX::LastShares& aLastShares,
      const FIX::LastPx& aLastPx,
      const FIX::CumQty& aCumQty,
      const FIX::AvgPx& aAvgPx )
    : Message(MsgType())
    {
      set(aOrderID);
      set(aExecID);
      set(aExecTransType);
      set(aOrdStatus);
      set(aSymbol);
      set(aSide);
      set(aOrderQty);
      set(aLastShares);
      set(aLastPx);
      set(aCumQty);
      set(aAvgPx);
    }